

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

void __thiscall directory::split(directory *this,bucket *bucket,int bucket_no)

{
  uint32_t uVar1;
  uint uVar2;
  byte bVar3;
  allocator_type *__a;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  index *i;
  undefined8 *puVar4;
  bucket *this_00;
  index index;
  bucket split_bucket;
  vector<index,_std::allocator<index>_> copy;
  fstream splitBucketFile;
  bucket local_2a8;
  undefined8 *local_280;
  undefined8 *local_278;
  long local_270;
  string *local_268;
  string local_260;
  allocator_type local_240 [528];
  
  uVar1 = this->depth;
  ::bucket::increaseDepth(bucket);
  uVar2 = ::bucket::getDepth(bucket);
  local_2a8.size = '\0';
  local_2a8.depth = 1;
  local_2a8.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.id = generateBucketId(&this->typeName);
  bVar3 = (byte)uVar1;
  local_2a8.depth = uVar2;
  if (this->depth < uVar2) {
    grow(this);
    (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[(1 << (bVar3 & 0x1f)) + bucket_no] = local_2a8.id;
  }
  else {
    uVar2 = (1 << (bVar3 - 1 & 0x1f)) + bucket_no;
    if (uVar2 < this->bucket_size) {
      bucket_no = uVar2;
    }
    (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[bucket_no] = local_2a8.id;
  }
  __a = local_240;
  std::vector<index,std::allocator<index>>::
  vector<__gnu_cxx::__normal_iterator<index*,std::vector<index,std::allocator<index>>>,void>
            ((vector<index,std::allocator<index>> *)&local_280,
             (bucket->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
             super__Vector_impl_data._M_start,
             (bucket->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
             super__Vector_impl_data._M_finish,__a);
  local_268 = &this->typeName;
  ::bucket::clear(bucket);
  for (puVar4 = local_280; puVar4 != local_278; puVar4 = (undefined8 *)((long)puVar4 + 0xc)) {
    __a = (allocator_type *)
          (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start;
    this_00 = &local_2a8;
    if ((*(uint32_t *)
          (__a + (ulong)(~(-1 << ((byte)this->depth & 0x1f)) & *(uint *)(puVar4 + 1)) * 4) ==
         local_2a8.id) ||
       (this_00 = bucket,
       *(uint32_t *)(__a + (ulong)(~(-1 << ((byte)this->depth & 0x1f)) & *(uint *)(puVar4 + 1)) * 4)
       == bucket->id)) {
      index.value = *(uint *)(puVar4 + 1);
      index._0_8_ = *puVar4;
      ::bucket::insert(this_00,index);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error",5);
    }
  }
  generateBucketFileName(&local_260,local_268,local_2a8.id);
  std::fstream::fstream(local_240,(string *)&local_260,_S_out|_S_bin);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_00;
  }
  ::bucket::write(&local_2a8,(int)local_240,__buf,(size_t)__a);
  std::fstream::~fstream(local_240);
  if (local_280 != (undefined8 *)0x0) {
    operator_delete(local_280,local_270 - (long)local_280);
  }
  if (local_2a8.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.indices.super__Vector_base<index,_std::allocator<index>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.indices.super__Vector_base<index,_std::allocator<index>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void directory::split(bucket &bucket, int bucket_no) {
    int local_depth, dir_depth = depth, pair_index;

    bucket.increaseDepth();

    local_depth = bucket.getDepth();

    class bucket split_bucket;

    split_bucket.id = generateBucketId(typeName);
    split_bucket.depth = local_depth;

    pair_index = pairIndex(bucket_no, local_depth);

    if(local_depth > depth) {
        grow();
        bucket_ids[bucket_no + (1 << dir_depth) ] = split_bucket.id;
    } else {
        if(bucket_no + (1 << (dir_depth - 1)) >= bucket_size) {

            bucket_ids[bucket_no ] = split_bucket.id;
        } else {

            bucket_ids[bucket_no + (1 << (dir_depth - 1)) ] = split_bucket.id;
        }
    }


    vector<index> copy = vector<index>(bucket.indices.begin(), bucket.indices.end());

    bucket.clear();

    for(auto &i: copy) {
        int _bucket_no = hash(i.value);

        if(bucket_ids[_bucket_no ] == split_bucket.id) {
            split_bucket.insert(i);
        } else if(bucket_ids[_bucket_no ] == bucket.id){
            bucket.insert(i);
        } else {
            cout << "error";
        }
    }

    fstream splitBucketFile(generateBucketFileName(typeName, split_bucket.id), OUTBIN);

    split_bucket.write(splitBucketFile);
}